

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O2

void __thiscall
cbtGImpactMeshShapePart::processAllTrianglesRay
          (cbtGImpactMeshShapePart *this,cbtTriangleCallback *callback,cbtVector3 *rayFrom,
          cbtVector3 *rayTo)

{
  uint uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  bool bVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar7;
  cbtAlignedObjectArray<int> collided;
  cbtVector3 rayDir;
  cbtPrimitiveTriangle triangle;
  cbtAlignedObjectArray<int> local_a0;
  cbtVector3 local_80;
  cbtPrimitiveTriangle local_70;
  undefined1 auVar6 [56];
  
  auVar6 = in_ZMM0._8_56_;
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1c])();
  local_a0.m_ownsMemory = true;
  local_a0.m_data = (int *)0x0;
  local_a0.m_size = 0;
  local_a0.m_capacity = 0;
  cVar7 = ::operator-(rayTo,rayFrom);
  auVar5._0_8_ = cVar7.m_floats._0_8_;
  auVar5._8_56_ = auVar6;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = cVar7.m_floats._8_8_;
  local_80.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar2);
  cbtVector3::normalize(&local_80);
  cbtGImpactQuantizedBvh::rayQuery
            (&(this->super_cbtGImpactShapeInterface).m_box_set,&local_80,rayFrom,&local_a0);
  lVar3 = (long)local_a0.m_size;
  if (lVar3 == 0) {
    (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1d])(this);
  }
  else {
    uVar1 = (this->m_primitive_manager).m_part;
    local_70.m_margin = 0.01;
    while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
      cbtGImpactShapeInterface::getPrimitiveTriangle
                (&this->super_cbtGImpactShapeInterface,local_a0.m_data[lVar3],&local_70);
      (*callback->_vptr_cbtTriangleCallback[2])
                (callback,&local_70,(ulong)uVar1,(ulong)(uint)local_a0.m_data[lVar3]);
    }
    (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1d])(this);
  }
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_a0);
  return;
}

Assistant:

void cbtGImpactMeshShapePart::processAllTrianglesRay(cbtTriangleCallback* callback, const cbtVector3& rayFrom, const cbtVector3& rayTo) const
{
	lockChildShapes();

	cbtAlignedObjectArray<int> collided;
	cbtVector3 rayDir(rayTo - rayFrom);
	rayDir.normalize();
	m_box_set.rayQuery(rayDir, rayFrom, collided);

	if (collided.size() == 0)
	{
		unlockChildShapes();
		return;
	}

	int part = (int)getPart();
	cbtPrimitiveTriangle triangle;
	int i = collided.size();
	while (i--)
	{
		getPrimitiveTriangle(collided[i], triangle);
		callback->processTriangle(triangle.m_vertices, part, collided[i]);
	}
	unlockChildShapes();
}